

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_type_createAnonymousMetaclass(sysbvm_context_t *context,sysbvm_tuple_t supertype)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  size_t superTypeSlotCount;
  size_t slotCount;
  sysbvm_metaclass_t *result;
  sysbvm_tuple_t supertype_local;
  sysbvm_context_t *context_local;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).metaclassType,0x1e);
  psVar1[2].header.field_0.typePointer = supertype;
  sVar2 = sysbvm_tuple_bitflags_encode(1);
  psVar1[4].field_1.pointers[0] = sVar2;
  superTypeSlotCount = 0x1d;
  if ((supertype != 0) && (sVar3 = sysbvm_type_getTotalSlotCount(supertype), 0x1d < sVar3)) {
    superTypeSlotCount = sVar3;
  }
  sVar2 = sysbvm_tuple_size_encode(context,superTypeSlotCount);
  psVar1[3].field_1.pointers[0] = sVar2;
  sVar2 = sysbvm_tuple_size_encode(context,0);
  psVar1[4].header.field_0.typePointer = sVar2;
  sVar2 = sysbvm_tuple_size_encode(context,0);
  psVar1[4].header.identityHashAndFlags = (int)sVar2;
  psVar1[4].header.objectSize = (int)(sVar2 >> 0x20);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousMetaclass(sysbvm_context_t *context, sysbvm_tuple_t supertype)
{
    sysbvm_metaclass_t* result = (sysbvm_metaclass_t*)sysbvm_context_allocatePointerTuple(context, context->roots.metaclassType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_metaclass_t));
    result->super.super.supertype = supertype;
    result->super.super.flags = sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_METATYPE_REQUIRED_FLAGS);

    size_t slotCount = SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_class_t);
    if(supertype)
    {
        size_t superTypeSlotCount = sysbvm_type_getTotalSlotCount(supertype);
        if(superTypeSlotCount > slotCount)
            slotCount = superTypeSlotCount;
    }
    
    result->super.super.totalSlotCount = sysbvm_tuple_size_encode(context, slotCount);
    result->super.super.instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->super.super.instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    return (sysbvm_tuple_t)result;
}